

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  allocator<char> local_c1;
  string local_c0;
  salsa_file_wrapper local_a0;
  salsa_file_wrapper sfw;
  bool strings_is_ready;
  undefined1 local_78 [4];
  int c;
  string out_file_name;
  string in_file_name;
  string key;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(in_file_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(out_file_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  while (iVar2 = getopt(argc,argv,"i:o:k:vh"), iVar2 != -1) {
    switch(iVar2) {
    case 0x68:
    case 0x76:
      print_help();
      goto LAB_00102821;
    case 0x69:
      std::__cxx11::string::operator=((string *)(out_file_name.field_2._M_local_buf + 8),_optarg);
      break;
    case 0x6b:
      std::__cxx11::string::operator=((string *)(in_file_name.field_2._M_local_buf + 8),_optarg);
      break;
    case 0x6f:
      std::__cxx11::string::operator=((string *)local_78,_optarg);
    }
  }
  sfw.m_cryptoman._M_t.super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
  super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
  super__Head_base<0UL,_salsa20_*,_false>._M_head_impl._7_1_ = 1;
  bVar1 = std::__cxx11::string::empty();
  sfw.m_cryptoman._M_t.super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
  super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
  super__Head_base<0UL,_salsa20_*,_false>._M_head_impl._7_1_ =
       (sfw.m_cryptoman._M_t.super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
        super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
        super__Head_base<0UL,_salsa20_*,_false>._M_head_impl._7_1_ & 1 & (bVar1 ^ 0xff) & 1) != 0;
  bVar1 = std::__cxx11::string::empty();
  sfw.m_cryptoman._M_t.super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
  super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
  super__Head_base<0UL,_salsa20_*,_false>._M_head_impl._7_1_ =
       (sfw.m_cryptoman._M_t.super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
        super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
        super__Head_base<0UL,_salsa20_*,_false>._M_head_impl._7_1_ & 1 & (bVar1 ^ 0xff) & 1) != 0;
  bVar1 = std::__cxx11::string::empty();
  sfw.m_cryptoman._M_t.super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
  super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
  super__Head_base<0UL,_salsa20_*,_false>._M_head_impl._7_1_ =
       (sfw.m_cryptoman._M_t.super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
        super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
        super__Head_base<0UL,_salsa20_*,_false>._M_head_impl._7_1_ & 1 & (bVar1 ^ 0xff) & 1) != 0;
  if ((bool)sfw.m_cryptoman._M_t.super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
            super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
            super__Head_base<0UL,_salsa20_*,_false>._M_head_impl._7_1_) {
    salsa_file_wrapper::salsa_file_wrapper(&local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"99990001",&local_c1);
    salsa_file_wrapper::set_key_and_nonce
              (&local_a0,(string *)((long)&in_file_name.field_2 + 8),&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    salsa_file_wrapper::crypt_file
              (&local_a0,(string *)((long)&out_file_name.field_2 + 8),(string *)local_78,true);
    salsa_file_wrapper::~salsa_file_wrapper(&local_a0);
  }
  else {
    print_help();
  }
LAB_00102821:
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(out_file_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(in_file_name.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    (void)argc;
    (void)argv;

    std::string key;

    std::string in_file_name;
    std::string out_file_name;

    int c = 0;
    while ((c = getopt(argc, argv, "i:o:k:vh")) != -1)
    {
        switch (c)
        {
        case 'i': in_file_name = optarg;
            break;
        case 'o': out_file_name = optarg;
            break;
        case 'k': key = optarg;
            break;
        case 'v':
        case 'h':
            print_help();
            return 0;
        }
    }

    bool strings_is_ready = true;
    strings_is_ready &= !key.empty();
    strings_is_ready &= !in_file_name.empty();
    strings_is_ready &= !out_file_name.empty();

    if (strings_is_ready)
    {
        salsa_file_wrapper sfw;
        sfw.set_key_and_nonce(key, c_nonce);
        sfw.crypt_file(in_file_name, out_file_name, true);
    }
    else
    {
        print_help();
    }

    return 0;
}